

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O1

bool tinyusdz::tydra::detail::ExportSkelAnimation(Animation *anim,SkelAnimation *dst,string *err)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  undefined4 uVar3;
  float fVar4;
  long lVar5;
  pointer paVar6;
  mapped_type mVar7;
  bool bVar8;
  undefined8 uVar9;
  bool bVar10;
  string *psVar11;
  bool bVar12;
  half hVar13;
  half hVar14;
  half hVar15;
  uint uVar16;
  _Base_ptr p_Var17;
  mapped_type *pmVar18;
  type poVar19;
  undefined7 uVar29;
  mapped_type *pmVar20;
  _Base_ptr p_Var21;
  size_type sVar22;
  mapped_type *pmVar23;
  mapped_type *pmVar24;
  _Base_ptr p_Var25;
  mapped_type *pmVar26;
  ostream *poVar27;
  long *plVar28;
  pointer pqVar30;
  size_type *psVar31;
  char *pcVar32;
  size_t sVar33;
  bool bVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  _Base_ptr p_Var36;
  _Base_ptr *pp_Var37;
  size_type sVar38;
  _Base_ptr p_Var39;
  undefined1 in_R8 [8];
  _Base_ptr p_Var40;
  undefined1 args_1 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  ulong uVar41;
  long lVar42;
  bool bVar43;
  pointer paVar44;
  bool bVar45;
  bool bVar46;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> static_txs;
  uint64_t joint_id;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> translations;
  map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
  ts_txs;
  float tc;
  StringAndIdMap joint_idMap;
  ostringstream ss_e;
  string local_488;
  vector<float,_std::allocator<float>_> local_468;
  _Base_ptr local_450;
  string *local_448;
  Animation *local_440;
  SkelAnimation *local_438;
  undefined1 local_430 [8];
  undefined8 *local_428 [2];
  undefined8 local_418 [2];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_408;
  _Base_ptr local_3f0;
  ulong local_3e8;
  _Base_ptr local_3e0;
  undefined1 local_3d8 [24];
  size_type sStack_3c0;
  float local_3b8;
  size_t local_3b0;
  __node_base_ptr p_Stack_3a8;
  _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
  local_3a0;
  _Base_ptr local_370;
  float local_364;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  StringAndIdMap local_358;
  undefined1 local_2f8 [4];
  half hStack_2f4;
  undefined2 uStack_2f2;
  undefined2 uStack_2f0;
  undefined2 uStack_2ee;
  undefined4 uStack_2ec;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  local_2e8;
  undefined1 uStack_2e7;
  float fStack_2e6;
  ushort local_2e0;
  TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> local_2d8 [2];
  ios_base local_288 [264];
  _Base_ptr local_180;
  unsigned_long local_178;
  key_type local_170;
  key_type local_150;
  key_type local_130;
  key_type local_110;
  key_type local_f0;
  key_type local_d0;
  key_type local_b0;
  key_type local_90;
  key_type local_70;
  key_type local_50;
  
  ::std::__cxx11::string::_M_assign((string *)dst);
  value = &anim->display_name;
  if ((anim->display_name)._M_string_length != 0) {
    nonstd::optional_lite::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&(dst->meta).displayName,value);
  }
  local_440 = anim;
  if ((anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00330623:
    if ((anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      (dst->blendShapeWeights)._value_empty = true;
    }
    else {
      local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header;
      local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header;
      local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var17 = (anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header;
      local_438 = dst;
      local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var17 != p_Var1) {
        do {
          sVar33 = local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if (local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            sVar33 = 0;
          }
          StringAndIdMap::add(&local_358,(string *)(p_Var17 + 1),sVar33);
          p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
        } while ((_Rb_tree_header *)p_Var17 != p_Var1);
      }
      sVar38 = 0;
      if (local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        sVar38 = local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      local_448 = err;
      local_360 = value;
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                (&local_408,sVar38,(allocator_type *)local_2f8);
      p_Var17 = (anim->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var17 != p_Var1) {
        do {
          uStack_2f0 = 0;
          uStack_2ee = 0;
          uStack_2ec = 0;
          local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       )0x0;
          _local_2f8 = (pointer)&local_2e8;
          ::std::__cxx11::string::_M_assign((string *)local_2f8);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,*(long *)(p_Var17 + 1),
                     (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
          pmVar18 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::at(&local_358._s_to_i,&local_130);
          ::std::__cxx11::string::operator=
                    ((string *)
                     (local_408.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + *pmVar18),(string *)local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if (_local_2f8 != (pointer)&local_2e8) {
            operator_delete(_local_2f8,CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) + 1);
          }
          p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
        } while ((_Rb_tree_header *)p_Var17 != p_Var1);
      }
      nonstd::optional_lite::optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
      ::operator=((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)
                  &(local_438->blendShapes)._attrib,&local_408);
      local_3d8._0_8_ = &p_Stack_3a8;
      local_3d8._8_8_ = (pointer)0x1;
      local_3d8._16_8_ = (pointer)0x0;
      sStack_3c0 = 0;
      local_3b8 = 1.0;
      local_3b0 = 0;
      p_Stack_3a8 = (__node_base_ptr)0x0;
      p_Var17 = (local_440->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      p_Var25 = p_Var17[2]._M_parent;
      if (p_Var17[2]._M_left != p_Var25) {
        uVar41 = 0;
        do {
          local_3a0._M_impl._0_4_ = (&p_Var25->_M_color)[uVar41 * 2];
          _local_2f8 = (pointer)local_3d8;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_3d8,&local_3a0,local_2f8);
          uVar41 = uVar41 + 1;
          p_Var25 = p_Var17[2]._M_parent;
        } while (uVar41 < (ulong)((long)p_Var17[2]._M_left - (long)p_Var25 >> 3));
      }
      local_3a0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3a0._M_impl.super__Rb_tree_header._M_header;
      local_3a0._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_3a0._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3a0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3a0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((pointer)local_3d8._16_8_ != (pointer)0x0) {
        paVar44 = (pointer)local_3d8._16_8_;
        do {
          fVar4 = *(float *)((long)paVar44->_M_elems + 8);
          _local_2f8 = (pointer)0x7ff8000000000000;
          if (!NAN(fVar4)) {
            if (ABS(fVar4) == INFINITY) {
              _local_2f8 = *(pointer *)(&DAT_0060cd40 + (ulong)((uint)fVar4 >> 0x1f) * 8);
            }
            else {
              _local_2f8 = (pointer)(double)fVar4;
            }
          }
          pmVar26 = ::std::
                    map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[]((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                                  *)&local_3a0,(key_type_conflict3 *)local_2f8);
          ::std::vector<float,_std::allocator<float>_>::resize
                    (pmVar26,(long)local_408.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_408.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
          paVar44 = *(pointer *)paVar44->_M_elems;
        } while (paVar44 != (pointer)0x0);
      }
      local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      p_Var17 = (local_440->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      bVar45 = (_Rb_tree_header *)p_Var17 == p_Var1;
      if (!bVar45) {
        paVar35 = &local_488.field_2;
LAB_00330985:
        p_Var25 = p_Var17[2]._M_parent;
        bVar45 = p_Var17[2]._M_left != p_Var25;
        if (bVar45) {
          local_450 = p_Var17 + 1;
          uVar41 = 0;
          do {
            local_430._0_4_ = (&p_Var25->_M_color)[uVar41 * 2];
            _local_2f8 = (pointer)CONCAT44(_hStack_2f4,(&p_Var25->_M_color)[uVar41 * 2]);
            local_3e8 = ::std::
                        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)local_3d8,(key_type_conflict1 *)local_2f8);
            if (local_3e8 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
              poVar27 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0x206);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
              local_428[0] = local_418;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_428,
                         "All blendshape weights should have same timeCodes. timeCode {} is only seen in `blendShapeWeights` animation channel of blendShape {}"
                         ,"");
              fmt::format<float,std::__cxx11::string>
                        (&local_488,(fmt *)local_428,(string *)local_430,(float *)local_450,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8)
              ;
              poVar27 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2f8,local_488._M_dataplus._M_p,
                                   local_488._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar27,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p != paVar35) {
                operator_delete(local_488._M_dataplus._M_p,
                                local_488.field_2._M_allocated_capacity + 1);
              }
              if (local_428[0] != local_418) {
                operator_delete(local_428[0],local_418[0] + 1);
              }
              if (local_448 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar28 = (long *)::std::__cxx11::string::append((char *)local_428);
                psVar31 = (size_type *)(plVar28 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar28 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar31) {
                  local_488.field_2._M_allocated_capacity = *psVar31;
                  local_488.field_2._8_8_ = plVar28[3];
                  local_488._M_dataplus._M_p = (pointer)paVar35;
                }
                else {
                  local_488.field_2._M_allocated_capacity = *psVar31;
                  local_488._M_dataplus._M_p = (pointer)*plVar28;
                }
                local_488._M_string_length = plVar28[1];
                *plVar28 = (long)psVar31;
                plVar28[1] = 0;
                *(undefined1 *)(plVar28 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)local_448,(ulong)local_488._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_488._M_dataplus._M_p != paVar35) {
                  operator_delete(local_488._M_dataplus._M_p,
                                  local_488.field_2._M_allocated_capacity + 1);
                }
                if (local_428[0] != local_418) {
                  operator_delete(local_428[0],local_418[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
              ::std::ios_base::~ios_base(local_288);
            }
            else {
              local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_150,*(long *)(p_Var17 + 1),
                         (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
              pmVar18 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ::at(&local_358._s_to_i,&local_150);
              mVar7 = *pmVar18;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p,
                                local_150.field_2._M_allocated_capacity + 1);
              }
              _local_2f8 = (pointer)0x7ff8000000000000;
              if (!NAN((float)local_430._0_4_)) {
                if (ABS((float)local_430._0_4_) == INFINITY) {
                  uVar16 = movmskps(0x7f800000,ZEXT416((uint)local_430._0_4_));
                  _local_2f8 = *(pointer *)(&DAT_0060cd40 + (ulong)(uVar16 & 1) * 8);
                }
                else {
                  _local_2f8 = (pointer)(double)(float)local_430._0_4_;
                }
              }
              pmVar26 = ::std::
                        map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                        ::at((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                              *)&local_3a0,(key_type_conflict3 *)local_2f8);
              (pmVar26->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[mVar7] =
                   *(float *)(&(p_Var17[2]._M_parent)->field_0x4 + uVar41 * 8);
            }
            if (local_3e8 == 0) goto LAB_00330f2e;
            uVar41 = uVar41 + 1;
            p_Var25 = p_Var17[2]._M_parent;
            bVar45 = uVar41 < (ulong)((long)p_Var17[2]._M_left - (long)p_Var25 >> 3);
          } while (bVar45);
        }
        if ((char)p_Var17[2]._M_color == _S_black) {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,*(long *)(p_Var17 + 1),
                     (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
          pmVar18 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::at(&local_358._s_to_i,&local_170);
          mVar7 = *pmVar18;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          uVar41 = mVar7 + 1;
          if ((ulong)((long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) < uVar41) {
            ::std::vector<float,_std::allocator<float>_>::resize(&local_468,uVar41);
          }
          if ((char)p_Var17[2]._M_color == _S_red) {
            pcVar32 = 
            "const value_type &nonstd::optional_lite::optional<float>::value() const [T = float]";
            goto LAB_00331291;
          }
          local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[mVar7] = *(float *)&p_Var17[2].field_0x4;
        }
        if (!bVar45) goto code_r0x00330d86;
LAB_00330f2e:
        if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        ::std::
        _Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                    *)&local_3a0,
                   (_Link_type)local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent);
LAB_00330f56:
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_3d8);
        goto LAB_00330f63;
      }
LAB_00330da0:
      local_2d8[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_2d8[0]._17_8_ = 0;
      local_2d8[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2d8[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_2d8[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      _local_2f8 = (pointer)0x0;
      uStack_2f0 = 0;
      uStack_2ee = 0;
      uStack_2ec = 0;
      local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   )0x0;
      uStack_2e7 = 0;
      _fStack_2e6 = 0;
      local_2e0._0_1_ = false;
      local_2e0._1_1_ = false;
      bVar46 = (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2 ==
               (long)local_408.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_408.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (bVar46) {
        ::std::vector<float,_std::allocator<float>_>::operator=
                  ((vector<float,_std::allocator<float>_> *)local_2f8,&local_468);
      }
      value = local_360;
      dst = local_438;
      local_2e0 = (ushort)bVar46;
      for (p_Var17 = local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var17 != &local_3a0._M_impl.super__Rb_tree_header;
          p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17)) {
        TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::add_sample
                  (local_2d8,*(double *)(p_Var17 + 1),
                   (vector<float,_std::allocator<float>_> *)&p_Var17[1]._M_parent);
      }
      nonstd::optional_lite::
      optional<tinyusdz::Animatable<std::vector<float,std::allocator<float>>>>::operator=
                ((optional<tinyusdz::Animatable<std::vector<float,std::allocator<float>>>> *)
                 &(dst->blendShapeWeights)._attrib,
                 (Animatable<std::vector<float,_std::allocator<float>_>_> *)local_2f8);
      ::std::
      vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ::~vector(&local_2d8[0]._samples);
      if (_local_2f8 != (pointer)0x0) {
        operator_delete(_local_2f8,
                        CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8);
      }
      if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      ::std::
      _Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                  *)&local_3a0,
                 (_Link_type)local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_3d8);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_408);
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::_M_erase(&local_358._s_to_i._M_t,
                 (_Link_type)
                 local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_358,
                 (_Link_type)
                 local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      anim = local_440;
      if (!bVar45) goto LAB_00330f95;
    }
    ::std::__cxx11::string::_M_assign((string *)dst);
    bVar45 = true;
    if ((anim->display_name)._M_string_length != 0) {
      nonstd::optional_lite::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&(dst->meta).displayName,value);
    }
  }
  else {
    local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header;
    local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var17 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(anim->channels_map)._M_t._M_impl.super__Rb_tree_header;
    local_438 = dst;
    local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var17 != p_Var1) {
      do {
        sVar33 = local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count !=
            local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          sVar33 = 0;
        }
        StringAndIdMap::add(&local_358,(string *)(p_Var17 + 1),sVar33);
        p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
      } while ((_Rb_tree_header *)p_Var17 != p_Var1);
    }
    sVar38 = 0;
    if (local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      sVar38 = local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    local_448 = err;
    local_360 = value;
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              (&local_408,sVar38,(allocator_type *)local_2f8);
    p_Var17 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var17 != p_Var1) {
      do {
        uStack_2f0 = 0;
        uStack_2ee = 0;
        uStack_2ec = 0;
        local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     )0x0;
        _local_2f8 = (pointer)&local_2e8;
        ::std::__cxx11::string::_M_assign((string *)local_2f8);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,*(long *)(p_Var17 + 1),
                   (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
        pmVar18 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::at(&local_358._s_to_i,&local_50);
        ::std::__cxx11::string::operator=
                  ((string *)
                   (local_408.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start + *pmVar18),(string *)local_2f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (_local_2f8 != (pointer)&local_2e8) {
          operator_delete(_local_2f8,CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) + 1);
        }
        p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
      } while ((_Rb_tree_header *)p_Var17 != p_Var1);
    }
    poVar19 = nonstd::optional_lite::
              optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::operator=
                        ((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)
                         &(local_438->joints)._attrib,&local_408);
    p_Var17 = (local_440->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar29 = (undefined7)((ulong)poVar19 >> 8);
    local_450 = p_Var17;
    if ((_Rb_tree_header *)p_Var17 == p_Var1) {
      bVar43 = true;
      bVar34 = true;
      bVar8 = true;
      local_3e8 = CONCAT44(local_3e8._4_4_,(int)CONCAT71(uVar29,1));
      bVar45 = true;
      bVar46 = true;
    }
    else {
      bVar46 = true;
      bVar10 = false;
      bVar45 = true;
      local_3e8 = CONCAT44(local_3e8._4_4_,(int)CONCAT71(uVar29,1));
      bVar8 = true;
      bVar34 = true;
      bVar43 = true;
      do {
        pp_Var37 = &p_Var17[2]._M_parent;
        p_Var21 = p_Var17[2]._M_left;
        p_Var39 = (_Base_ptr)pp_Var37;
        for (p_Var25 = p_Var21; p_Var25 != (_Base_ptr)0x0;
            p_Var25 = (&p_Var25->_M_left)[(int)p_Var25[1]._M_color < 1]) {
          if (0 < (int)p_Var25[1]._M_color) {
            p_Var39 = p_Var25;
          }
        }
        p_Var25 = p_Var21;
        p_Var40 = (_Base_ptr)pp_Var37;
        p_Var36 = (_Base_ptr)pp_Var37;
        if ((p_Var39 != (_Base_ptr)pp_Var37) && (p_Var36 = p_Var39, 1 < (int)p_Var39[1]._M_color)) {
          p_Var36 = (_Base_ptr)pp_Var37;
        }
        for (; p_Var25 != (_Base_ptr)0x0;
            p_Var25 = (&p_Var25->_M_left)[(int)p_Var25[1]._M_color < 2]) {
          if (1 < (int)p_Var25[1]._M_color) {
            p_Var40 = p_Var25;
          }
        }
        in_R8 = (undefined1  [8])pp_Var37;
        p_Var25 = (_Base_ptr)pp_Var37;
        if ((p_Var40 != (_Base_ptr)pp_Var37) && (p_Var25 = p_Var40, 2 < (int)p_Var40[1]._M_color)) {
          p_Var25 = (_Base_ptr)pp_Var37;
        }
        for (; p_Var21 != (_Base_ptr)0x0;
            p_Var21 = (&p_Var21->_M_left)[(int)p_Var21[1]._M_color < 3]) {
          if (2 < (int)p_Var21[1]._M_color) {
            in_R8 = (undefined1  [8])p_Var21;
          }
        }
        p_Var21 = (_Base_ptr)pp_Var37;
        if ((in_R8 != (undefined1  [8])pp_Var37) &&
           (p_Var21 = (_Base_ptr)in_R8, 3 < (int)((_Base_ptr)((long)in_R8 + 0x20))->_M_color)) {
          p_Var21 = (_Base_ptr)pp_Var37;
          in_R8 = (undefined1  [8])pp_Var37;
        }
        bVar12 = bVar10;
        if (p_Var36 != (_Base_ptr)pp_Var37) {
          bVar46 = bVar10;
          bVar12 = bVar8;
        }
        bVar8 = bVar12;
        bVar12 = bVar10;
        if (p_Var25 != (_Base_ptr)pp_Var37) {
          bVar45 = bVar10;
          bVar12 = bVar34;
        }
        bVar34 = bVar12;
        if (p_Var21 == (_Base_ptr)pp_Var37) {
          bVar43 = bVar10;
        }
        uVar16 = (uint)local_3e8 & 0xff;
        if (p_Var21 != (_Base_ptr)pp_Var37) {
          uVar16 = 0;
        }
        local_3e8 = CONCAT44(local_3e8._4_4_,uVar16);
        p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
      } while ((_Rb_tree_header *)p_Var17 != p_Var1);
    }
    anim = local_440;
    if ((bool)(bVar8 | bVar46)) {
      if (!(bool)(bVar34 | bVar45)) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
        poVar27 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xf7);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
        pcVar32 = 
        "rotation channel partially exists among joints. No joints have animation channel or all joints have animation channels."
        ;
        lVar42 = 0x77;
        goto LAB_0032ea1b;
      }
      if (!bVar43 && (local_3e8 & 1) == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
        poVar27 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xfb);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
        pcVar32 = 
        "scale channel partially exists among joints. No joints have animation channel or all joints have animation channels."
        ;
        lVar42 = 0x74;
        goto LAB_0032ea1b;
      }
      if (bVar46) {
        local_3d8._0_8_ = (pointer)0x0;
        local_3d8._8_8_ = (pointer)0x0;
        local_3d8._16_8_ = (pointer)0x0;
        _local_2f8 = (pointer)0x3f8000003f800000;
        uStack_2f0 = 0;
        uStack_2ee = 0x3f80;
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
        _M_fill_assign((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       local_3d8,
                       (long)local_408.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_408.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)local_2f8);
        local_2d8[0]._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_2d8[0]._17_8_ = 0;
        local_2d8[0]._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2d8[0]._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_2d8[0]._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        _local_2f8 = (pointer)0x0;
        uStack_2f0 = 0;
        uStack_2ee = 0;
        uStack_2ec = 0;
        local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     )0x0;
        uStack_2e7 = 0;
        _fStack_2e6 = 0;
        local_2e0._0_1_ = false;
        local_2e0._1_1_ = false;
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::operator=
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   local_2f8,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   local_3d8);
        dst = local_438;
        local_2e0 = 1;
        nonstd::optional_lite::
        optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
        ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
                     *)&(local_438->translations)._attrib,
                    (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                     *)local_2f8);
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
        ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                   *)local_2d8);
        if (_local_2f8 != (pointer)0x0) {
          operator_delete(_local_2f8,
                          CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8);
        }
        if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ - local_3d8._0_8_);
        }
LAB_0032f387:
        if (bVar45) {
          local_3d8._0_8_ = (pointer)0x0;
          local_3d8._8_8_ = (pointer)0x0;
          local_3d8._16_8_ = (pointer)0x0;
          local_3a0._M_impl._0_8_ = (undefined1 *)0x0;
          local_3a0._M_impl.super__Rb_tree_header._M_header._0_8_ = 0x3f80000000000000;
          ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
          _M_fill_assign((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         local_3d8,
                         (long)local_408.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_408.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5,
                         (value_type *)&local_3a0);
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_2d8[0]._17_8_ = 0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          _local_2f8 = (pointer)0x0;
          uStack_2f0 = 0;
          uStack_2ee = 0;
          uStack_2ec = 0;
          local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       )0x0;
          uStack_2e7 = 0;
          _fStack_2e6 = 0;
          local_2e0._0_1_ = false;
          local_2e0._1_1_ = false;
          ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::operator=
                    ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                     local_2f8,
                     (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                     local_3d8);
          local_2e0 = 1;
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
          ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                       *)&(dst->rotations)._attrib,
                      (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                       *)local_2f8);
          ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
          ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                     *)local_2d8);
          if (_local_2f8 != (pointer)0x0) {
            operator_delete(_local_2f8,
                            CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8)
            ;
          }
          if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ - local_3d8._0_8_);
          }
        }
        else {
          local_3d8._0_8_ = &p_Stack_3a8;
          local_3d8._8_8_ = (pointer)0x1;
          local_3d8._16_8_ = (pointer)0x0;
          sStack_3c0 = 0;
          local_3b8 = 1.0;
          local_3b0 = 0;
          p_Stack_3a8 = (__node_base_ptr)0x0;
          p_Var17 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pp_Var37 = &p_Var17[2]._M_parent;
          p_Var25 = (_Base_ptr)pp_Var37;
          for (p_Var17 = p_Var17[2]._M_left; p_Var17 != (_Base_ptr)0x0;
              p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < 2]) {
            if (1 < (int)p_Var17[1]._M_color) {
              p_Var25 = p_Var17;
            }
          }
          p_Var17 = (_Base_ptr)pp_Var37;
          if ((p_Var25 != (_Base_ptr)pp_Var37) && (p_Var17 = p_Var25, 2 < (int)p_Var25[1]._M_color))
          {
            p_Var17 = (_Base_ptr)pp_Var37;
          }
          if ((p_Var17 != (_Base_ptr)pp_Var37) &&
             (p_Var25 = *(_Base_ptr *)(p_Var17 + 7), p_Var17[7]._M_parent != p_Var25)) {
            lVar42 = 0;
            uVar41 = 0;
            do {
              local_3a0._M_impl._0_4_ = *(undefined4 *)((long)&p_Var25->_M_color + lVar42);
              _local_2f8 = (pointer)local_3d8;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_3d8,&local_3a0,local_2f8);
              uVar41 = uVar41 + 1;
              p_Var25 = *(_Base_ptr *)(p_Var17 + 7);
              lVar42 = lVar42 + 0x14;
            } while (uVar41 < (ulong)(((long)p_Var17[7]._M_parent - (long)p_Var25 >> 2) *
                                     -0x3333333333333333));
          }
          local_3a0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_3a0._M_impl.super__Rb_tree_header._M_header;
          local_3a0._M_impl.super__Rb_tree_header._M_header._0_8_ =
               local_3a0._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_3a0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_3a0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((pointer)local_3d8._16_8_ != (pointer)0x0) {
            paVar44 = (pointer)local_3d8._16_8_;
            do {
              fVar4 = *(float *)((long)paVar44->_M_elems + 8);
              _local_2f8 = (pointer)0x7ff8000000000000;
              if (!NAN(fVar4)) {
                if (ABS(fVar4) == INFINITY) {
                  _local_2f8 = *(pointer *)(&DAT_0060cd40 + (ulong)((uint)fVar4 >> 0x1f) * 8);
                }
                else {
                  _local_2f8 = (pointer)(double)fVar4;
                }
              }
              pmVar23 = ::std::
                        map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                        ::operator[]((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                                      *)&local_3a0,(key_type_conflict3 *)local_2f8);
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::resize
                        (pmVar23,(long)local_408.
                                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_408.
                                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
              paVar44 = *(pointer *)paVar44->_M_elems;
            } while (paVar44 != (pointer)0x0);
          }
          local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          anim = local_440;
          for (p_Var17 = (local_440->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left; (_Rb_tree_header *)p_Var17 != p_Var1;
              p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17)) {
            pp_Var37 = &p_Var17[2]._M_parent;
            p_Var21 = (_Base_ptr)pp_Var37;
            for (p_Var25 = p_Var17[2]._M_left; p_Var25 != (_Base_ptr)0x0;
                p_Var25 = (&p_Var25->_M_left)[(int)p_Var25[1]._M_color < 2]) {
              if (1 < (int)p_Var25[1]._M_color) {
                p_Var21 = p_Var25;
              }
            }
            p_Var25 = (_Base_ptr)pp_Var37;
            if ((p_Var21 != (_Base_ptr)pp_Var37) &&
               (p_Var25 = p_Var21, 2 < (int)p_Var21[1]._M_color)) {
              p_Var25 = (_Base_ptr)pp_Var37;
            }
            if (p_Var25 != (_Base_ptr)pp_Var37) {
              p_Var21 = *(_Base_ptr *)(p_Var25 + 7);
              local_450 = p_Var25;
              local_3f0 = p_Var17;
              if (p_Var25[7]._M_parent != p_Var21) {
                local_370 = p_Var17 + 1;
                lVar42 = 0;
                uVar41 = 0;
                do {
                  paVar35 = &local_488.field_2;
                  uVar3 = *(undefined4 *)((long)&p_Var21->_M_color + lVar42);
                  local_430._0_4_ = uVar3;
                  _local_2f8 = (pointer)CONCAT44(_hStack_2f4,uVar3);
                  p_Var17 = (_Base_ptr)
                            ::std::
                            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                     *)local_3d8,(key_type_conflict1 *)local_2f8);
                  if (p_Var17 == (_Base_ptr)0x0) {
                    local_3e0 = p_Var17;
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"():",3);
                    poVar27 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_2f8,0x171);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
                    local_428[0] = local_418;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_428,
                               "All animation channels should have same timeCodes. timeCode {} is only seen in `rotation` animation channel of joint {}"
                               ,"");
                    fmt::format<float,std::__cxx11::string>
                              (&local_488,(fmt *)local_428,(string *)local_430,(float *)local_370,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_R8);
                    poVar27 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,local_488._M_dataplus._M_p,
                                         local_488._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar27,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_488._M_dataplus._M_p != paVar35) {
                      operator_delete(local_488._M_dataplus._M_p,
                                      local_488.field_2._M_allocated_capacity + 1);
                    }
                    if (local_428[0] != local_418) {
                      operator_delete(local_428[0],local_418[0] + 1);
                    }
                    p_Var17 = local_3e0;
                    if (local_448 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar28 = (long *)::std::__cxx11::string::append((char *)local_428);
                      psVar31 = (size_type *)(plVar28 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar28 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar31) {
                        local_488.field_2._M_allocated_capacity = *psVar31;
                        local_488.field_2._8_8_ = plVar28[3];
                        local_488._M_dataplus._M_p = (pointer)paVar35;
                      }
                      else {
                        local_488.field_2._M_allocated_capacity = *psVar31;
                        local_488._M_dataplus._M_p = (pointer)*plVar28;
                      }
                      local_488._M_string_length = plVar28[1];
                      *plVar28 = (long)psVar31;
                      plVar28[1] = 0;
                      *(undefined1 *)(plVar28 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_448,(ulong)local_488._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_488._M_dataplus._M_p != paVar35) {
                        operator_delete(local_488._M_dataplus._M_p,
                                        local_488.field_2._M_allocated_capacity + 1);
                      }
                      if (local_428[0] != local_418) {
                        operator_delete(local_428[0],local_418[0] + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                    ::std::ios_base::~ios_base(local_288);
                  }
                  else {
                    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_b0,*(long *)(local_3f0 + 1),
                               (long)&(local_3f0[1]._M_parent)->_M_color + *(long *)(local_3f0 + 1))
                    ;
                    pmVar18 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                              ::at(&local_358._s_to_i,&local_b0);
                    mVar7 = *pmVar18;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                    _local_2f8 = (pointer)0x7ff8000000000000;
                    if (!NAN((float)local_430._0_4_)) {
                      if (ABS((float)local_430._0_4_) == INFINITY) {
                        uVar16 = movmskps(0x7f800000,ZEXT416((uint)local_430._0_4_));
                        _local_2f8 = *(pointer *)(&DAT_0060cd40 + (ulong)(uVar16 & 1) * 8);
                      }
                      else {
                        _local_2f8 = (pointer)(double)(float)local_430._0_4_;
                      }
                    }
                    pmVar23 = ::std::
                              map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                              ::at((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                                    *)&local_3a0,(key_type_conflict3 *)local_2f8);
                    puVar2 = (undefined8 *)(*(long *)(local_450 + 7) + 4 + lVar42);
                    uVar9 = puVar2[1];
                    pqVar30 = (pmVar23->
                              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                              )._M_impl.super__Vector_impl_data._M_start + mVar7;
                    *(undefined8 *)(pqVar30->imag)._M_elems = *puVar2;
                    *(undefined8 *)((pqVar30->imag)._M_elems + 2) = uVar9;
                    anim = local_440;
                  }
                  if (p_Var17 == (_Base_ptr)0x0) {
                    if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_468.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_468.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_468.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    ::std::
                    _Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                    ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                                *)&local_3a0,
                               (_Link_type)
                               local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent);
                    goto LAB_00330f56;
                  }
                  uVar41 = uVar41 + 1;
                  p_Var21 = *(_Base_ptr *)(local_450 + 7);
                  lVar42 = lVar42 + 0x14;
                } while (uVar41 < (ulong)(((long)local_450[7]._M_parent - (long)p_Var21 >> 2) *
                                         -0x3333333333333333));
              }
              p_Var17 = local_3f0;
              if (*(char *)&local_450[6]._M_parent == '\x01') {
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d0,*(long *)(local_3f0 + 1),
                           (long)&(local_3f0[1]._M_parent)->_M_color + *(long *)(local_3f0 + 1));
                pmVar18 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          ::at(&local_358._s_to_i,&local_d0);
                mVar7 = *pmVar18;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
                uVar41 = mVar7 + 1;
                if ((ulong)((long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 4) < uVar41) {
                  ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                  resize((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         &local_468,uVar41);
                }
                if (*(char *)&local_450[6]._M_parent == '\0') {
                  pcVar32 = 
                  "const value_type &nonstd::optional_lite::optional<std::array<float, 4>>::value() const [T = std::array<float, 4>]"
                  ;
                  goto LAB_00331291;
                }
                uVar9 = *(undefined8 *)((long)&local_450[6]._M_left + 4);
                *(undefined8 *)
                 (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + mVar7 * 4) =
                     *(undefined8 *)((long)&local_450[6]._M_parent + 4);
                *(undefined8 *)
                 (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + mVar7 * 4 + 2) = uVar9;
              }
            }
          }
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_2d8[0]._17_8_ = 0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          _local_2f8 = (pointer)0x0;
          uStack_2f0 = 0;
          uStack_2ee = 0;
          uStack_2ec = 0;
          local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       )0x0;
          uStack_2e7 = 0;
          _fStack_2e6 = 0;
          local_2e0._0_1_ = false;
          local_2e0._1_1_ = false;
          bVar45 = (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 4 ==
                   (long)local_408.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_408.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 5;
          if (bVar45) {
            ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
            operator=((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                      local_2f8,
                      (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                      &local_468);
          }
          local_2e0 = (ushort)bVar45;
          for (p_Var25 = local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var25 != &local_3a0._M_impl.super__Rb_tree_header;
              p_Var25 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var25)) {
            TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::add_sample((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                          *)local_2d8,*(double *)(p_Var25 + 1),
                         (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         &p_Var25[1]._M_parent);
          }
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
          ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                       *)&(local_438->rotations)._attrib,
                      (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                       *)local_2f8);
          ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
          ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                     *)local_2d8);
          if (_local_2f8 != (pointer)0x0) {
            operator_delete(_local_2f8,
                            CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8)
            ;
          }
          if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          ::std::
          _Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
          ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                      *)&local_3a0,
                     (_Link_type)local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_3d8);
          dst = local_438;
          if ((_Rb_tree_header *)p_Var17 != p_Var1) goto LAB_00330f63;
        }
        if ((local_3e8 & 1) == 0) {
          local_3d8._0_8_ = &p_Stack_3a8;
          local_3d8._8_8_ = (pointer)0x1;
          local_3d8._16_8_ = (pointer)0x0;
          sStack_3c0 = 0;
          local_3b8 = 1.0;
          local_3b0 = 0;
          p_Stack_3a8 = (__node_base_ptr)0x0;
          p_Var17 = (anim->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pp_Var37 = &p_Var17[2]._M_parent;
          p_Var25 = (_Base_ptr)pp_Var37;
          for (p_Var17 = p_Var17[2]._M_left; p_Var17 != (_Base_ptr)0x0;
              p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < 3]) {
            if (2 < (int)p_Var17[1]._M_color) {
              p_Var25 = p_Var17;
            }
          }
          p_Var17 = (_Base_ptr)pp_Var37;
          if ((p_Var25 != (_Base_ptr)pp_Var37) && (p_Var17 = p_Var25, 3 < (int)p_Var25[1]._M_color))
          {
            p_Var17 = (_Base_ptr)pp_Var37;
          }
          if ((p_Var17 != (_Base_ptr)pp_Var37) &&
             (p_Var25 = p_Var17[8]._M_left, p_Var17[8]._M_right != p_Var25)) {
            lVar42 = 0;
            uVar41 = 0;
            do {
              local_3a0._M_impl._0_4_ = *(undefined4 *)((long)&p_Var25->_M_color + lVar42);
              _local_2f8 = (pointer)local_3d8;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_3d8,&local_3a0,local_2f8);
              uVar41 = uVar41 + 1;
              p_Var25 = p_Var17[8]._M_left;
              lVar42 = lVar42 + 0x10;
            } while (uVar41 < (ulong)((long)p_Var17[8]._M_right - (long)p_Var25 >> 4));
          }
          local_3a0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_3a0._M_impl.super__Rb_tree_header._M_header;
          local_3a0._M_impl.super__Rb_tree_header._M_header._0_8_ =
               local_3a0._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_3a0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_3a0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((pointer)local_3d8._16_8_ != (pointer)0x0) {
            paVar44 = (pointer)local_3d8._16_8_;
            do {
              fVar4 = *(float *)((long)paVar44->_M_elems + 8);
              _local_2f8 = (pointer)0x7ff8000000000000;
              if (!NAN(fVar4)) {
                if (ABS(fVar4) == INFINITY) {
                  _local_2f8 = *(pointer *)(&DAT_0060cd40 + (ulong)((uint)fVar4 >> 0x1f) * 8);
                }
                else {
                  _local_2f8 = (pointer)(double)fVar4;
                }
              }
              pmVar24 = ::std::
                        map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                        ::operator[]((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                                      *)&local_3a0,(key_type_conflict3 *)local_2f8);
              ::std::
              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              ::resize(pmVar24,(long)local_408.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_408.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              paVar44 = *(pointer *)paVar44->_M_elems;
            } while (paVar44 != (pointer)0x0);
          }
          local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          anim = local_440;
          for (p_Var17 = (local_440->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left; (_Rb_tree_header *)p_Var17 != p_Var1;
              p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17)) {
            pp_Var37 = &p_Var17[2]._M_parent;
            p_Var21 = (_Base_ptr)pp_Var37;
            for (p_Var25 = p_Var17[2]._M_left; p_Var25 != (_Base_ptr)0x0;
                p_Var25 = (&p_Var25->_M_left)[(int)p_Var25[1]._M_color < 3]) {
              if (2 < (int)p_Var25[1]._M_color) {
                p_Var21 = p_Var25;
              }
            }
            p_Var25 = (_Base_ptr)pp_Var37;
            if ((p_Var21 != (_Base_ptr)pp_Var37) &&
               (p_Var25 = p_Var21, 3 < (int)p_Var21[1]._M_color)) {
              p_Var25 = (_Base_ptr)pp_Var37;
            }
            if (p_Var25 != (_Base_ptr)pp_Var37) {
              p_Var21 = p_Var25[8]._M_left;
              local_450 = p_Var25;
              local_3e0 = p_Var17;
              if (p_Var25[8]._M_right != p_Var21) {
                local_370 = p_Var17 + 1;
                lVar42 = 0;
                uVar41 = 0;
                do {
                  p_Var17 = local_3e0;
                  paVar35 = &local_488.field_2;
                  uVar3 = *(undefined4 *)((long)&p_Var21->_M_color + lVar42);
                  local_430._0_4_ = uVar3;
                  _local_2f8 = (pointer)CONCAT44(_hStack_2f4,uVar3);
                  local_3e8 = ::std::
                              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                       *)local_3d8,(key_type_conflict1 *)local_2f8);
                  if (local_3e8 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"():",3);
                    poVar27 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_2f8,0x1bd);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
                    local_428[0] = local_418;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_428,
                               "All animation channels should have same timeCodes. timeCode {} is only seen in `scale` animation channel of joint {}"
                               ,"");
                    fmt::format<float,std::__cxx11::string>
                              (&local_488,(fmt *)local_428,(string *)local_430,(float *)local_370,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_R8);
                    poVar27 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,local_488._M_dataplus._M_p,
                                         local_488._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar27,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_488._M_dataplus._M_p != paVar35) {
                      operator_delete(local_488._M_dataplus._M_p,
                                      local_488.field_2._M_allocated_capacity + 1);
                    }
                    if (local_428[0] != local_418) {
                      operator_delete(local_428[0],local_418[0] + 1);
                    }
                    if (local_448 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar28 = (long *)::std::__cxx11::string::append((char *)local_428);
                      psVar31 = (size_type *)(plVar28 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar28 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar31) {
                        local_488.field_2._M_allocated_capacity = *psVar31;
                        local_488.field_2._8_8_ = plVar28[3];
                        local_488._M_dataplus._M_p = (pointer)paVar35;
                      }
                      else {
                        local_488.field_2._M_allocated_capacity = *psVar31;
                        local_488._M_dataplus._M_p = (pointer)*plVar28;
                      }
                      local_488._M_string_length = plVar28[1];
                      *plVar28 = (long)psVar31;
                      plVar28[1] = 0;
                      *(undefined1 *)(plVar28 + 2) = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)local_448,(ulong)local_488._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_488._M_dataplus._M_p != paVar35) {
                        operator_delete(local_488._M_dataplus._M_p,
                                        local_488.field_2._M_allocated_capacity + 1);
                      }
                      if (local_428[0] != local_418) {
                        operator_delete(local_428[0],local_418[0] + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                    ::std::ios_base::~ios_base(local_288);
                  }
                  else {
                    lVar5 = *(long *)(p_Var17 + 1);
                    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_f0,lVar5,
                               (long)&(p_Var17[1]._M_parent)->_M_color + lVar5);
                    pmVar18 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                              ::at(&local_358._s_to_i,&local_f0);
                    local_3f0 = (_Base_ptr)*pmVar18;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                      operator_delete(local_f0._M_dataplus._M_p,
                                      local_f0.field_2._M_allocated_capacity + 1);
                    }
                    _local_2f8 = (pointer)0x7ff8000000000000;
                    if (!NAN((float)local_430._0_4_)) {
                      if (ABS((float)local_430._0_4_) == INFINITY) {
                        uVar16 = movmskps(0x7f800000,ZEXT416((uint)local_430._0_4_));
                        _local_2f8 = *(pointer *)(&DAT_0060cd40 + (ulong)(uVar16 & 1) * 8);
                      }
                      else {
                        _local_2f8 = (pointer)(double)(float)local_430._0_4_;
                      }
                    }
                    pmVar24 = ::std::
                              map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                              ::at((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                                    *)&local_3a0,(key_type_conflict3 *)local_2f8);
                    p_Var17 = local_450;
                    hVar13 = tinyusdz::value::float_to_half_full
                                       (*(float *)(&(local_450[8]._M_left)->field_0x4 + lVar42));
                    hVar14 = tinyusdz::value::float_to_half_full
                                       (*(float *)((long)&(p_Var17[8]._M_left)->_M_parent + lVar42))
                    ;
                    hVar15 = tinyusdz::value::float_to_half_full
                                       (*(float *)((long)&(p_Var17[8]._M_left)->_M_parent +
                                                  lVar42 + 4));
                    paVar6 = (pmVar24->
                             super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    paVar6[(long)local_3f0]._M_elems[0].value = hVar13.value;
                    paVar6[(long)local_3f0]._M_elems[1].value = hVar14.value;
                    paVar6[(long)local_3f0]._M_elems[2].value = hVar15.value;
                    anim = local_440;
                  }
                  if (local_3e8 == 0) {
                    if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_468.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_468.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_468.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    ::std::
                    _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                    ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                                *)&local_3a0,
                               (_Link_type)
                               local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent);
                    goto LAB_00330f56;
                  }
                  uVar41 = uVar41 + 1;
                  p_Var21 = local_450[8]._M_left;
                  lVar42 = lVar42 + 0x10;
                } while (uVar41 < (ulong)((long)local_450[8]._M_right - (long)p_Var21 >> 4));
              }
              p_Var17 = local_3e0;
              if ((char)local_450[8]._M_color == _S_black) {
                local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_110,*(long *)(local_3e0 + 1),
                           (long)&(local_3e0[1]._M_parent)->_M_color + *(long *)(local_3e0 + 1));
                pmVar18 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          ::at(&local_358._s_to_i,&local_110);
                mVar7 = *pmVar18;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  operator_delete(local_110._M_dataplus._M_p,
                                  local_110.field_2._M_allocated_capacity + 1);
                }
                if ((ulong)(((long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 1) *
                           -0x5555555555555555) < mVar7 + 1) {
                  ::std::
                  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  ::resize((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            *)&local_468,mVar7 + 1);
                }
                if ((((char)local_450[8]._M_color == _S_red) ||
                    (hVar13 = tinyusdz::value::float_to_half_full(*(float *)&local_450[8].field_0x4)
                    , (char)local_450[8]._M_color == _S_red)) ||
                   (hVar14 = tinyusdz::value::float_to_half_full(*(float *)&local_450[8]._M_parent),
                   (char)local_450[8]._M_color == _S_red)) goto LAB_00331265;
                hVar15 = tinyusdz::value::float_to_half_full
                                   (*(float *)((long)&local_450[8]._M_parent + 4));
                *(uint16_t *)
                 ((long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + mVar7 * 6) = hVar13.value;
                *(uint16_t *)
                 ((long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + mVar7 * 6 + 2) = hVar14.value;
                *(uint16_t *)
                 ((long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + mVar7 * 6 + 4) = hVar15.value;
                p_Var17 = local_3e0;
              }
            }
          }
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_2d8[0]._17_8_ = 0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          _local_2f8 = (pointer)0x0;
          uStack_2f0 = 0;
          uStack_2ee = 0;
          uStack_2ec = 0;
          local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       )0x0;
          uStack_2e7 = 0;
          _fStack_2e6 = 0;
          local_2e0._0_1_ = false;
          local_2e0._1_1_ = false;
          bVar45 = ((long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 1) * -0x5555555555555555 -
                   ((long)local_408.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_408.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 5) == 0;
          if (bVar45) {
            ::std::
            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            ::operator=((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)local_2f8,
                        (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)&local_468);
          }
          local_2e0 = (ushort)bVar45;
          for (p_Var25 = local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var25 != &local_3a0._M_impl.super__Rb_tree_header;
              p_Var25 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var25)) {
            TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
            ::add_sample((TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)local_2d8,*(double *)(p_Var25 + 1),
                         (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          *)&p_Var25[1]._M_parent);
          }
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
          ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                       *)&(local_438->scales)._attrib,
                      (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                       *)local_2f8);
          ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
          ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                     *)local_2d8);
          if (_local_2f8 != (pointer)0x0) {
            operator_delete(_local_2f8,
                            CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8)
            ;
          }
          if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          ::std::
          _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
          ::_M_erase((_Rb_tree<double,_std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                      *)&local_3a0,
                     (_Link_type)local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_3d8);
          dst = local_438;
          if ((_Rb_tree_header *)p_Var17 != p_Var1) goto LAB_00330f63;
        }
        else {
          local_3d8._0_8_ = (pointer)0x0;
          local_3d8._8_8_ = (pointer)0x0;
          local_3d8._16_8_ = (pointer)0x0;
          lVar42 = (long)local_408.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_408.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          hVar13 = tinyusdz::value::float_to_half_full(1.0);
          _local_2f8 = (pointer)CONCAT62(stack0xfffffffffffffd0a,hVar13.value);
          hVar13 = tinyusdz::value::float_to_half_full(1.0);
          local_2f8 = (undefined1  [4])CONCAT22(hVar13.value,local_2f8._0_2_);
          hVar13 = tinyusdz::value::float_to_half_full(1.0);
          _local_2f8 = (_Type)CONCAT24(hVar13.value,local_2f8);
          ::std::
          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::_M_fill_assign((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            *)local_3d8,lVar42 >> 5,(value_type *)local_2f8);
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_2d8[0]._17_8_ = 0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_2d8[0]._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          _local_2f8 = (pointer)0x0;
          uStack_2f0 = 0;
          uStack_2ee = 0;
          uStack_2ec = 0;
          local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       )0x0;
          uStack_2e7 = 0;
          _fStack_2e6 = 0;
          local_2e0._0_1_ = false;
          local_2e0._1_1_ = false;
          ::std::
          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ::operator=((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)local_2f8,
                      (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)local_3d8);
          local_2e0 = 1;
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
          ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                       *)&(dst->scales)._attrib,
                      (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                       *)local_2f8);
          ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
          ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                     *)local_2d8);
          if (_local_2f8 != (pointer)0x0) {
            operator_delete(_local_2f8,
                            CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8)
            ;
          }
          if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ - local_3d8._0_8_);
          }
        }
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_408);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::_M_erase(&local_358._s_to_i._M_t,
                   (_Link_type)
                   local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        ::std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_358,
                   (_Link_type)
                   local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        value = local_360;
        err = local_448;
        goto LAB_00330623;
      }
      local_3d8._0_8_ = &p_Stack_3a8;
      local_3d8._8_8_ = (pointer)0x1;
      local_3d8._16_8_ = (pointer)0x0;
      sStack_3c0 = 0;
      local_3b8 = 1.0;
      local_3b0 = 0;
      p_Stack_3a8 = (__node_base_ptr)0x0;
      pp_Var37 = &local_450[2]._M_parent;
      p_Var25 = (_Base_ptr)pp_Var37;
      for (p_Var17 = local_450[2]._M_left; p_Var17 != (_Base_ptr)0x0;
          p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < 1]) {
        if (0 < (int)p_Var17[1]._M_color) {
          p_Var25 = p_Var17;
        }
      }
      p_Var17 = (_Base_ptr)pp_Var37;
      if ((p_Var25 != (_Base_ptr)pp_Var37) && (p_Var17 = p_Var25, 1 < (int)p_Var25[1]._M_color)) {
        p_Var17 = (_Base_ptr)pp_Var37;
      }
      if ((p_Var17 != (_Base_ptr)pp_Var37) &&
         (p_Var25 = p_Var17[5]._M_parent, p_Var17[5]._M_left != p_Var25)) {
        lVar42 = 0;
        uVar41 = 0;
        do {
          local_3a0._M_impl._0_4_ = *(undefined4 *)((long)&p_Var25->_M_color + lVar42);
          _local_2f8 = (pointer)local_3d8;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_3d8,&local_3a0,local_2f8);
          uVar41 = uVar41 + 1;
          p_Var25 = p_Var17[5]._M_parent;
          lVar42 = lVar42 + 0x10;
        } while (uVar41 < (ulong)((long)p_Var17[5]._M_left - (long)p_Var25 >> 4));
      }
      local_3a0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3a0._M_impl.super__Rb_tree_header._M_header;
      local_3a0._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_3a0._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3a0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3a0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((pointer)local_3d8._16_8_ != (pointer)0x0) {
        paVar44 = (pointer)local_3d8._16_8_;
        do {
          fVar4 = *(float *)((long)paVar44->_M_elems + 8);
          _local_2f8 = (pointer)0x7ff8000000000000;
          if (!NAN(fVar4)) {
            if (ABS(fVar4) == INFINITY) {
              _local_2f8 = *(pointer *)(&DAT_0060cd40 + (ulong)((uint)fVar4 >> 0x1f) * 8);
            }
            else {
              _local_2f8 = (pointer)(double)fVar4;
            }
          }
          pmVar20 = ::std::
                    map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                    ::operator[]((map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                                  *)&local_3a0,(key_type_conflict3 *)local_2f8);
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::resize
                    (pmVar20,(long)local_408.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_408.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
          paVar44 = *(pointer *)paVar44->_M_elems;
        } while (paVar44 != (pointer)0x0);
      }
      local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      anim = local_440;
      for (p_Var17 = (local_440->channels_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var17 != p_Var1;
          p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17)) {
        pp_Var37 = &p_Var17[2]._M_parent;
        p_Var21 = (_Base_ptr)pp_Var37;
        for (p_Var25 = p_Var17[2]._M_left; p_Var25 != (_Base_ptr)0x0;
            p_Var25 = (&p_Var25->_M_left)[(int)p_Var25[1]._M_color < 1]) {
          if (0 < (int)p_Var25[1]._M_color) {
            p_Var21 = p_Var25;
          }
        }
        p_Var25 = (_Base_ptr)pp_Var37;
        if ((p_Var21 != (_Base_ptr)pp_Var37) && (p_Var25 = p_Var21, 1 < (int)p_Var21[1]._M_color)) {
          p_Var25 = (_Base_ptr)pp_Var37;
        }
        if (p_Var25 != (_Base_ptr)pp_Var37) {
          p_Var21 = p_Var25[5]._M_parent;
          local_3f0 = p_Var25;
          local_3e0 = p_Var17;
          if (p_Var25[5]._M_left != p_Var21) {
            local_180 = p_Var17 + 1;
            lVar42 = 0;
            p_Var17 = (_Base_ptr)0x0;
            do {
              p_Var25 = local_3e0;
              local_364 = *(float *)((long)&p_Var21->_M_color + lVar42);
              _local_2f8 = (pointer)CONCAT44(_hStack_2f4,local_364);
              local_450 = p_Var17;
              sVar22 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)local_3d8,(key_type_conflict1 *)local_2f8);
              if (sVar22 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
                poVar27 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0x127);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
                local_428[0] = local_418;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_428,
                           "All animation channels should have same timeCodes. timeCode {} is only seen in `translation` animation channel of joint {}"
                           ,"");
                fmt::format<float,std::__cxx11::string>
                          (&local_488,(fmt *)local_428,(string *)&local_364,(float *)local_180,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_R8);
                poVar27 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,local_488._M_dataplus._M_p,
                                     local_488._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar27,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_488._M_dataplus._M_p != &local_488.field_2) {
                  operator_delete(local_488._M_dataplus._M_p,
                                  local_488.field_2._M_allocated_capacity + 1);
                }
                psVar11 = local_448;
                if (local_428[0] != local_418) {
                  operator_delete(local_428[0],local_418[0] + 1);
                }
                if (psVar11 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar28 = (long *)::std::__cxx11::string::append((char *)local_428);
                  psVar31 = (size_type *)(plVar28 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar28 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar31) {
                    local_488.field_2._M_allocated_capacity = *psVar31;
                    local_488.field_2._8_8_ = plVar28[3];
                    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
                  }
                  else {
                    local_488.field_2._M_allocated_capacity = *psVar31;
                    local_488._M_dataplus._M_p = (pointer)*plVar28;
                  }
                  local_488._M_string_length = plVar28[1];
                  *plVar28 = (long)psVar31;
                  plVar28[1] = 0;
                  *(undefined1 *)(plVar28 + 2) = 0;
                  ::std::__cxx11::string::_M_append
                            ((char *)psVar11,(ulong)local_488._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_488._M_dataplus._M_p != &local_488.field_2) {
                    operator_delete(local_488._M_dataplus._M_p,
                                    local_488.field_2._M_allocated_capacity + 1);
                  }
                  if (local_428[0] != local_418) {
                    operator_delete(local_428[0],local_418[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                ::std::ios_base::~ios_base(local_288);
LAB_00331221:
                if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_468.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_468.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                ::std::
                _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                ::_M_erase(&local_3a0,
                           (_Link_type)local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent);
                goto LAB_00330f56;
              }
              lVar5 = *(long *)(p_Var25 + 1);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,lVar5,(long)&(p_Var25[1]._M_parent)->_M_color + lVar5);
              pmVar18 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ::at(&local_358._s_to_i,&local_70);
              p_Var17 = (_Base_ptr)*pmVar18;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              _local_2f8 = (pointer)0x7ff8000000000000;
              if (!NAN(local_364)) {
                if (ABS(local_364) == INFINITY) {
                  uVar16 = movmskps(0x7f800000,ZEXT416((uint)local_364));
                  _local_2f8 = *(pointer *)(&DAT_0060cd40 + (ulong)(uVar16 & 1) * 8);
                }
                else {
                  _local_2f8 = (pointer)(double)local_364;
                }
              }
              local_430 = (undefined1  [8])p_Var17;
              pmVar20 = ::std::
                        map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                        ::at((map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                              *)&local_3a0,(key_type_conflict3 *)local_2f8);
              paVar44 = (pmVar20->
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              p_Var17 = (_Base_ptr)
                        (((long)(pmVar20->
                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)paVar44 >> 2) *
                        -0x5555555555555555);
              if (p_Var17 < (ulong)local_430) {
                local_370 = (_Base_ptr)local_430;
                args_1 = local_430;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
                poVar27 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0x12e);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
                local_428[0] = local_418;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_428,"Internal error. joint_id {} exceeds # of joints {}",
                           "");
                local_178 = ((long)(pmVar20->
                                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pmVar20->
                                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 2) *
                            -0x5555555555555555;
                fmt::format<unsigned_long,unsigned_long>
                          (&local_488,(fmt *)local_428,(string *)local_430,&local_178,
                           (unsigned_long *)args_1);
                poVar27 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,local_488._M_dataplus._M_p,
                                     local_488._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar27,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_488._M_dataplus._M_p != &local_488.field_2) {
                  operator_delete(local_488._M_dataplus._M_p,
                                  local_488.field_2._M_allocated_capacity + 1);
                }
                anim = local_440;
                if (local_428[0] != local_418) {
                  operator_delete(local_428[0],local_418[0] + 1);
                }
                if (local_448 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar28 = (long *)::std::__cxx11::string::append((char *)local_428);
                  psVar31 = (size_type *)(plVar28 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar28 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar31) {
                    local_488.field_2._M_allocated_capacity = *psVar31;
                    local_488.field_2._8_8_ = plVar28[3];
                    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
                  }
                  else {
                    local_488.field_2._M_allocated_capacity = *psVar31;
                    local_488._M_dataplus._M_p = (pointer)*plVar28;
                  }
                  local_488._M_string_length = plVar28[1];
                  *plVar28 = (long)psVar31;
                  plVar28[1] = 0;
                  *(undefined1 *)(plVar28 + 2) = 0;
                  ::std::__cxx11::string::_M_append
                            ((char *)local_448,(ulong)local_488._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_488._M_dataplus._M_p != &local_488.field_2) {
                    operator_delete(local_488._M_dataplus._M_p,
                                    local_488.field_2._M_allocated_capacity + 1);
                  }
                  if (local_428[0] != local_418) {
                    operator_delete(local_428[0],local_418[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                ::std::ios_base::~ios_base(local_288);
                in_R8 = (undefined1  [8])local_370;
              }
              else {
                p_Var25 = local_3f0[5]._M_parent;
                paVar44[(long)local_430]._M_elems[2] =
                     *(float *)((long)&p_Var25->_M_parent + lVar42 + 4);
                *(undefined8 *)paVar44[(long)local_430]._M_elems =
                     *(undefined8 *)(&p_Var25->field_0x4 + lVar42);
                in_R8 = local_430;
                anim = local_440;
              }
              if (p_Var17 < (ulong)in_R8) goto LAB_00331221;
              p_Var17 = (_Base_ptr)((long)&local_450->_M_color + 1);
              p_Var21 = local_3f0[5]._M_parent;
              lVar42 = lVar42 + 0x10;
            } while (p_Var17 < (_Base_ptr)((long)local_3f0[5]._M_left - (long)p_Var21 >> 4));
          }
          p_Var17 = local_3e0;
          if (*(char *)&local_3f0[4]._M_right == '\x01') {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,*(long *)(local_3e0 + 1),
                       (long)&(local_3e0[1]._M_parent)->_M_color + *(long *)(local_3e0 + 1));
            pmVar18 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ::at(&local_358._s_to_i,&local_90);
            mVar7 = *pmVar18;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if ((ulong)(((long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
                mVar7 + 1) {
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              resize((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &local_468,mVar7 + 1);
            }
            if (*(char *)&local_3f0[4]._M_right == '\0') goto LAB_00331265;
            local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[mVar7 * 3 + 2] = *(float *)&local_3f0[5].field_0x4;
            *(undefined8 *)
             (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + mVar7 * 3) =
                 *(undefined8 *)((long)&local_3f0[4]._M_right + 4);
            p_Var17 = local_3e0;
          }
        }
      }
      local_2d8[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_2d8[0]._17_8_ = 0;
      local_2d8[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2d8[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_2d8[0]._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      _local_2f8 = (pointer)0x0;
      uStack_2f0 = 0;
      uStack_2ee = 0;
      uStack_2ec = 0;
      local_2e8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   )0x0;
      uStack_2e7 = 0;
      _fStack_2e6 = 0;
      local_2e0._0_1_ = false;
      local_2e0._1_1_ = false;
      bVar46 = ((long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
               ((long)local_408.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_408.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) == 0;
      if (bVar46) {
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::operator=
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   local_2f8,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &local_468);
      }
      local_2e0 = (ushort)bVar46;
      for (p_Var25 = local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var25 != &local_3a0._M_impl.super__Rb_tree_header;
          p_Var25 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var25)) {
        TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
        ::add_sample((TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                      *)local_2d8,*(double *)(p_Var25 + 1),
                     (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &p_Var25[1]._M_parent);
      }
      nonstd::optional_lite::
      optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
      ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>>
                   *)&(local_438->translations)._attrib,
                  (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                   *)local_2f8);
      ::std::
      vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
      ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                 *)local_2d8);
      if (_local_2f8 != (pointer)0x0) {
        operator_delete(_local_2f8,
                        CONCAT62(_fStack_2e6,CONCAT11(uStack_2e7,local_2e8)) - (long)_local_2f8);
      }
      if (local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_468.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      ::std::
      _Rb_tree<double,_std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
      ::_M_erase(&local_3a0,(_Link_type)local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent)
      ;
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_3d8);
      dst = local_438;
      if ((_Rb_tree_header *)p_Var17 == p_Var1) goto LAB_0032f387;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f8,"ExportSkelAnimation",0x13);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
      poVar27 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xf3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
      pcVar32 = 
      "translation channel partially exists among joints. No joints have animation channel or all joints have animation channels."
      ;
      lVar42 = 0x7a;
LAB_0032ea1b:
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,pcVar32,lVar42);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"\n",1);
      psVar11 = local_448;
      if (local_448 != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        plVar28 = (long *)::std::__cxx11::string::append((char *)&local_3a0);
        pqVar30 = (pointer)(plVar28 + 2);
        if ((pointer)*plVar28 == pqVar30) {
          local_3d8._16_8_ = *(undefined8 *)(pqVar30->imag)._M_elems;
          sStack_3c0 = plVar28[3];
          local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
        }
        else {
          local_3d8._16_8_ = *(undefined8 *)(pqVar30->imag)._M_elems;
          local_3d8._0_8_ = (pointer)*plVar28;
        }
        local_3d8._8_8_ = plVar28[1];
        *plVar28 = (long)pqVar30;
        plVar28[1] = 0;
        *(undefined1 *)(plVar28 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)psVar11,local_3d8._0_8_);
        if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
          operator_delete((void *)local_3d8._0_8_,
                          (ulong)((long)(_Hash_node_base **)local_3d8._16_8_ + 1));
        }
        if ((_Base_ptr *)local_3a0._M_impl._0_8_ !=
            &local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_3a0._M_impl._0_8_,
                          (ulong)((long)&((_Rb_tree_node_base *)
                                         &(local_3a0._M_impl.super__Rb_tree_header._M_header.
                                          _M_parent)->_M_color)->_M_color + 1));
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
      ::std::ios_base::~ios_base(local_288);
    }
LAB_00330f63:
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_408);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::_M_erase(&local_358._s_to_i._M_t,
               (_Link_type)local_358._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
    ;
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_358,
               (_Link_type)local_358._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
    ;
LAB_00330f95:
    bVar45 = false;
  }
  return bVar45;
code_r0x00330d86:
  p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
  bVar45 = (_Rb_tree_header *)p_Var17 == p_Var1;
  if (bVar45) goto LAB_00330da0;
  goto LAB_00330985;
LAB_00331265:
  pcVar32 = 
  "const value_type &nonstd::optional_lite::optional<std::array<float, 3>>::value() const [T = std::array<float, 3>]"
  ;
LAB_00331291:
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x584,pcVar32);
}

Assistant:

static bool ExportSkelAnimation(const Animation &anim, SkelAnimation *dst, std::string *err) {
  (void)err;
  dst->name = anim.prim_name;
  if (anim.display_name.size()) {
    dst->metas().displayName = anim.display_name;
  }

  auto float_to_uint = [](const float x) {
    union Fp {
      float f;
      uint32_t u;
    };
    Fp fp;
    fp.f = x;
 
    return fp.u;
  };

  auto uint_to_float = [](const uint32_t x) {
    union Fp {
      float f;
      uint32_t u;
    };
    Fp fp;
    fp.u = x;
 
    return fp.f;
  };

  // inf and nan(TimeCode::Default) aware upcast
  auto float_to_double = [](const float x) {
    if (std::isnan(x)) {
      return value::TimeCode::Default();
    }
    if (std::isinf(x)) {
      if (std::signbit(x)) {
        return -std::numeric_limits<double>::infinity();
      } else {
        return std::numeric_limits<double>::infinity();
      }
    }
    return double(x);
  };

  if (anim.channels_map.size()) {

    StringAndIdMap joint_idMap;
    for (const auto &channels : anim.channels_map)
    {
      uint64_t joint_id = uint64_t(joint_idMap.size());
      joint_idMap.add(channels.first, uint64_t(joint_id));
    }

    std::vector<value::token> joints(joint_idMap.size());
    for (const auto &channels : anim.channels_map) {
      joints[size_t(joint_idMap.at(channels.first))] = value::token(channels.first);
    }
    dst->joints = joints;

    bool no_tx_channel{true};
    bool no_rot_channel{true};
    bool no_scale_channel{true};

    bool all_joints_has_tx_channel{true};
    bool all_joints_has_rot_channel{true};
    bool all_joints_has_scale_channel{true};

    for (const auto &channels : anim.channels_map) {

      bool has_tx_channel;
      bool has_rot_channel;
      bool has_scale_channel;

      has_tx_channel = channels.second.count(AnimationChannel::ChannelType::Translation);
      has_rot_channel = channels.second.count(AnimationChannel::ChannelType::Rotation);
      has_scale_channel = channels.second.count(AnimationChannel::ChannelType::Scale);

      if (has_tx_channel) {
        no_tx_channel = false;
      } else {
        all_joints_has_tx_channel = false;
      }

      if (has_rot_channel) {
        no_rot_channel = false;
      } else {
        all_joints_has_rot_channel = false;
      }

      if (has_scale_channel) {
        no_scale_channel = false;
      } else {
        all_joints_has_scale_channel = false;
      }
    }

    if (!no_tx_channel && !all_joints_has_tx_channel) {
      PUSH_ERROR_AND_RETURN("translation channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (!no_rot_channel && !all_joints_has_rot_channel) {
      PUSH_ERROR_AND_RETURN("rotation channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (!no_scale_channel && !all_joints_has_scale_channel) {
      PUSH_ERROR_AND_RETURN("scale channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (no_tx_channel) {
      // Author static(default) value.
      std::vector<value::float3> translations;
      translations.assign(joints.size(), {1.0f, 1.0f, 1.0f});
      
      dst->translations.set_value(translations);
    } else {

      // All joints should have same timeCode.
      // First collect timeCodes for the first joint.
      //
      // when timeCode is NaN(value::TimeCode::Default), the behavior(key compare in unordered_set) is undefined,
      // so use byte representation.
      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &tx_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Translation);
        if (tx_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < tx_it->second.translations.samples.size(); t++) {
            timeCodes.insert(float_to_uint(tx_it->second.translations.samples[t].t));
          }
        }
      }

      // key: timeCode. value: values for each joints.
      std::map<double, std::vector<value::float3>> ts_txs;
      for (const auto &tc : timeCodes) {
        ts_txs[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::float3> static_txs;

      // Pack channel values
      for (const auto &channels : anim.channels_map) {

        const auto &tx_it = channels.second.find(AnimationChannel::ChannelType::Translation);
        if (tx_it != channels.second.end()) {

          for (size_t t = 0; t < tx_it->second.translations.samples.size(); t++) {
            float tc = tx_it->second.translations.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `translation` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::float3> &txs = ts_txs.at(float_to_double(tc));
            // just in case
            if (joint_id > txs.size()) {
              PUSH_ERROR_AND_RETURN(fmt::format("Internal error. joint_id {} exceeds # of joints {}", joint_id, txs.size()));
            }
            txs[size_t(joint_id)] = tx_it->second.translations.samples[t].value;
          }

          if (tx_it->second.translations.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_txs.size()) {
              static_txs.resize(size_t(joint_id+1));
            }
            static_txs[size_t(joint_id)] = tx_it->second.translations.static_value.value(); 
          }
        }
      }

      Animatable<std::vector<value::float3>> aval;
      if (static_txs.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_txs);
      }

      for (const auto &s : ts_txs) {
        aval.add_sample(s.first, s.second);
      } 

      dst->translations.set_value(aval);
    }

    if (no_rot_channel) {
      // Author static(default) value.
      std::vector<value::quatf> rots;
      value::quatf q;
      q.imag = {0.0f, 0.0f, 0.0f};
      q.real = 1.0f;
      rots.assign(joints.size(), q);

      dst->rotations.set_value(rots);
      
    } else {

      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &rot_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Rotation);
        if (rot_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < rot_it->second.rotations.samples.size(); t++) {
            timeCodes.insert(float_to_uint(rot_it->second.rotations.samples[t].t));
          }
        }

      }

      std::map<double, std::vector<value::quatf>> ts_rots;
      for (const auto &tc : timeCodes) {
        ts_rots[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::quatf> static_rots;

      for (const auto &channels : anim.channels_map) {

        const auto &rot_it = channels.second.find(AnimationChannel::ChannelType::Rotation);
        if (rot_it != channels.second.end()) {

          for (size_t t = 0; t < rot_it->second.rotations.samples.size(); t++) {
            float tc = rot_it->second.rotations.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `rotation` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::quatf> &rots = ts_rots.at(float_to_double(tc));
            value::quatf v;
            v[0] = rot_it->second.rotations.samples[t].value[0];
            v[1] = rot_it->second.rotations.samples[t].value[1];
            v[2] = rot_it->second.rotations.samples[t].value[2];
            v[3] = rot_it->second.rotations.samples[t].value[3];
            rots[size_t(joint_id)] = v;
          }

          if (rot_it->second.rotations.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_rots.size()) {
              static_rots.resize(size_t(joint_id+1));
            }
            value::quatf v;
            v[0] = rot_it->second.rotations.static_value.value()[0];
            v[1] = rot_it->second.rotations.static_value.value()[1];
            v[2] = rot_it->second.rotations.static_value.value()[2];
            v[3] = rot_it->second.rotations.static_value.value()[3];
            static_rots[size_t(joint_id)] = v;
          }
        }
      }

      Animatable<std::vector<value::quatf>> aval;
      if (static_rots.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_rots);
      }

      for (const auto &s : ts_rots) {
        aval.add_sample(s.first, s.second);
      } 

      dst->rotations.set_value(aval);
    }

    if (no_scale_channel) {
      // Author static(default) value.
      std::vector<value::half3> scales;
      scales.assign(joints.size(), {value::float_to_half_full(1.0f), value::float_to_half_full(1.0f), value::float_to_half_full(1.0f)});

      dst->scales.set_value(scales);
      
    } else {
      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &scale_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Scale);
        if (scale_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < scale_it->second.scales.samples.size(); t++) {
            timeCodes.insert(float_to_uint(scale_it->second.scales.samples[t].t));
          }
        }

      }

      std::map<double, std::vector<value::half3>> ts_scales;
      for (const auto &tc : timeCodes) {
        ts_scales[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::half3> static_scales;

      for (const auto &channels : anim.channels_map) {

        const auto &scale_it = channels.second.find(AnimationChannel::ChannelType::Scale);
        if (scale_it != channels.second.end()) {

          for (size_t t = 0; t < scale_it->second.scales.samples.size(); t++) {
            float tc = scale_it->second.scales.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `scale` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::half3> &scales = ts_scales.at(float_to_double(tc));
            value::half3 v;
            v[0] = value::float_to_half_full(scale_it->second.scales.samples[t].value[0]);
            v[1] = value::float_to_half_full(scale_it->second.scales.samples[t].value[1]);
            v[2] = value::float_to_half_full(scale_it->second.scales.samples[t].value[2]);
            scales[size_t(joint_id)] = v;
          }

          if (scale_it->second.scales.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_scales.size()) {
              static_scales.resize(size_t(joint_id+1));
            }
            value::half3 v;
            v[0] = value::float_to_half_full(scale_it->second.scales.static_value.value()[0]);
            v[1] = value::float_to_half_full(scale_it->second.scales.static_value.value()[1]);
            v[2] = value::float_to_half_full(scale_it->second.scales.static_value.value()[2]);
            static_scales[size_t(joint_id)] = v;
          }
        }
      }

      Animatable<std::vector<value::half3>> aval;
      if (static_scales.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_scales);
      }

      for (const auto &s : ts_scales) {
        aval.add_sample(s.first, s.second);
      } 

      dst->scales.set_value(aval);
    }
  }

  if (anim.blendshape_weights_map.size()) {
    StringAndIdMap target_idMap;
    for (const auto &target : anim.blendshape_weights_map)
    {
      uint64_t target_id = uint64_t(target_idMap.size());
      target_idMap.add(target.first, uint64_t(target_id));
    }

    std::vector<value::token> blendShapes(target_idMap.size());
    for (const auto &target : anim.blendshape_weights_map) {
      blendShapes[size_t(target_idMap.at(target.first))] = value::token(target.first);
    }
    dst->blendShapes = blendShapes;

    std::unordered_set<uint32_t> timeCodes;
    {
      const auto &weights_it = anim.blendshape_weights_map.cbegin();
      for (size_t t = 0; t < weights_it->second.samples.size(); t++) {
        timeCodes.insert(float_to_uint(weights_it->second.samples[t].t));
      }
    }

    std::map<double, std::vector<float>> ts_weights;
    for (const auto &tc : timeCodes) {
      ts_weights[float_to_double(uint_to_float(tc))].resize(blendShapes.size()); 
    }
    std::vector<float> static_weights;

    for (const auto &target : anim.blendshape_weights_map) {

      for (size_t t = 0; t < target.second.samples.size(); t++) {
        float tc = target.second.samples[t].t;
        if (!timeCodes.count(float_to_uint(tc))) {
          PUSH_ERROR_AND_RETURN(fmt::format("All blendshape weights should have same timeCodes. timeCode {} is only seen in `blendShapeWeights` animation channel of blendShape {}", tc, target.first));
        }
        uint64_t target_id = target_idMap.at(target.first);

        std::vector<float> &weights = ts_weights.at(float_to_double(tc));
        //DCOUT("weights.size " << weights.size() << ", target_id " << target_id);
        weights[size_t(target_id)] = target.second.samples[t].value;
      }

      if (target.second.static_value) {
        uint64_t target_id = target_idMap.at(target.first);
        if ((target_id +1) > static_weights.size()) {
          static_weights.resize(size_t(target_id+1));
        }
        static_weights[size_t(target_id)] = target.second.static_value.value(); 
      }
    }

    Animatable<std::vector<float>> aval;
    if (static_weights.size() == blendShapes.size()) {
      // Author static(default) value.
      aval.set_default(static_weights);
    }

    for (const auto &s : ts_weights) {
      aval.add_sample(s.first, s.second);
    } 

    dst->blendShapeWeights.set_value(aval);
  } else {
    // Just author 'blendShapeWeights' without value.
    dst->blendShapeWeights.set_value_empty();
  }

  dst->name = anim.prim_name;
  if (anim.display_name.size()) {
    dst->metas().displayName = anim.display_name;
  }
  return true;
}